

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.cpp
# Opt level: O2

bool duckdb::ExtensionHelper::TryAutoLoadExtension
               (DatabaseInstance *instance,string *extension_name)

{
  bool bVar1;
  DBConfig *pDVar2;
  FileSystem *fs;
  DBConfigOptions *options;
  string repository_url;
  ExtensionRepository autoinstall_repo;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  uStack_c8;
  string local_c0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined2 local_78;
  bool local_76;
  ExtensionRepository local_70;
  
  bVar1 = DatabaseInstance::ExtensionIsLoaded(instance,extension_name);
  if (!bVar1) {
    pDVar2 = DBConfig::GetConfig(instance);
    fs = FileSystem::GetFileSystem(instance);
    if ((pDVar2->options).autoinstall_known_extensions == true) {
      GetAutoInstallExtensionsRepository_abi_cxx11_(&local_c0,(duckdb *)&pDVar2->options,options);
      ExtensionRepository::GetRepositoryByUrl(&local_70,&local_c0);
      local_98._M_p = (pointer)&local_88;
      local_90 = 0;
      local_88._M_local_buf[0] = '\0';
      local_78._0_1_ = false;
      local_78._1_1_ = false;
      local_76 = false;
      local_a0 = (undefined1  [8])&local_70;
      InstallExtension((ExtensionHelper *)&uStack_c8,instance,fs,extension_name,
                       (ExtensionInstallOptions *)local_a0);
      ::std::
      unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
      ~unique_ptr(&uStack_c8);
      ::std::__cxx11::string::~string((string *)&local_98);
      ExtensionRepository::~ExtensionRepository(&local_70);
      ::std::__cxx11::string::~string((string *)&local_c0);
    }
    LoadExternalExtension(instance,fs,extension_name);
  }
  return true;
}

Assistant:

bool ExtensionHelper::TryAutoLoadExtension(DatabaseInstance &instance, const string &extension_name) noexcept {
	if (instance.ExtensionIsLoaded(extension_name)) {
		return true;
	}
	auto &dbconfig = DBConfig::GetConfig(instance);
	try {
		auto &fs = FileSystem::GetFileSystem(instance);
		if (dbconfig.options.autoinstall_known_extensions) {
			auto repository_url = GetAutoInstallExtensionsRepository(dbconfig.options);
			auto autoinstall_repo = ExtensionRepository::GetRepositoryByUrl(repository_url);
			ExtensionInstallOptions options;
			options.repository = autoinstall_repo;
			ExtensionHelper::InstallExtension(instance, fs, extension_name, options);
		}
		ExtensionHelper::LoadExternalExtension(instance, fs, extension_name);
		return true;
	} catch (...) {
		return false;
	}
}